

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopPolicy(cmMakefile *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  bVar1 = cmState::Snapshot::PopPolicy(&this->StateSnapshot);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&local_30,"cmake_policy POP without matching PUSH",&local_31);
    IssueMessage(this,FATAL_ERROR,&local_30,false);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void cmMakefile::PopPolicy()
{
  if (!this->StateSnapshot.PopPolicy())
    {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "cmake_policy POP without matching PUSH");
    }
}